

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O1

ostream * deqp::gles3::Functional::TransformFeedback::operator<<(ostream *str,DrawCall *call)

{
  ostream *poVar1;
  char *pcVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(str,"(",1);
  poVar1 = (ostream *)std::ostream::operator<<(str,call->numElements);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  pcVar2 = "paused";
  if ((ulong)call->transformFeedbackEnabled != 0) {
    pcVar2 = "resumed";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,pcVar2,(ulong)call->transformFeedbackEnabled | 6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const DrawCall& call)
{
	return str << "(" << call.numElements << ", " << (call.transformFeedbackEnabled ? "resumed" : "paused") << ")";
}